

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_ldd.c
# Opt level: O0

MDD lddmc_make_copynode(MDD ifeq,MDD ifneq)

{
  FILE *__stream;
  size_t sVar1;
  size_t sVar2;
  uint64_t local_38;
  uint64_t index;
  undefined1 auStack_28 [4];
  int created;
  mddnode n;
  MDD ifneq_local;
  MDD ifeq_local;
  
  n.b = ifneq;
  mddnode_makecopy((mddnode_t)auStack_28,ifneq,ifeq);
  local_38 = llmsset_lookup(nodes,_auStack_28,n.a,(int *)((long)&index + 4));
  if (local_38 == 0) {
    lddmc_refs_push(ifeq);
    lddmc_refs_push(n.b);
    sylvan_gc_RUN();
    lddmc_refs_pop(1);
    local_38 = llmsset_lookup(nodes,_auStack_28,n.a,(int *)((long)&index + 4));
    __stream = _stderr;
    if (local_38 == 0) {
      sVar1 = llmsset_count_marked_RUN(nodes);
      sVar2 = llmsset_get_size(nodes);
      fprintf(__stream,"MDD Unique table full, %zu of %zu buckets filled!\n",sVar1,sVar2);
      exit(1);
    }
  }
  if (index._4_4_ == 0) {
    sylvan_stats_count(3);
  }
  else {
    sylvan_stats_count(2);
  }
  return local_38;
}

Assistant:

MDD
lddmc_make_copynode(MDD ifeq, MDD ifneq)
{
    struct mddnode n;
    mddnode_makecopy(&n, ifneq, ifeq);

    int created;
    uint64_t index = llmsset_lookup(nodes, n.a, n.b, &created);
    if (index == 0) {
        lddmc_refs_push(ifeq);
        lddmc_refs_push(ifneq);
        RUN(sylvan_gc);
        lddmc_refs_pop(1);

        index = llmsset_lookup(nodes, n.a, n.b, &created);
        if (index == 0) {
            fprintf(stderr, "MDD Unique table full, %zu of %zu buckets filled!\n", llmsset_count_marked(nodes), llmsset_get_size(nodes));
            exit(1);
        }
    }

    if (created) sylvan_stats_count(LDD_NODES_CREATED);
    else sylvan_stats_count(LDD_NODES_REUSED);

    return (MDD)index;
}